

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O3

void Abc_NamStop(Abc_Nam_t *p)

{
  char *__ptr;
  int *piVar1;
  
  __ptr = (p->vBuffer).pArray;
  if (__ptr != (char *)0x0) {
    free(__ptr);
    (p->vBuffer).pArray = (char *)0x0;
  }
  (p->vBuffer).nCap = 0;
  (p->vBuffer).nSize = 0;
  piVar1 = (p->vInt2Handle).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vInt2Handle).pArray = (int *)0x0;
  }
  (p->vInt2Handle).nCap = 0;
  (p->vInt2Handle).nSize = 0;
  piVar1 = (p->vInt2Next).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vInt2Next).pArray = (int *)0x0;
  }
  (p->vInt2Next).nCap = 0;
  (p->vInt2Next).nSize = 0;
  if (p->pStore != (char *)0x0) {
    free(p->pStore);
    p->pStore = (char *)0x0;
  }
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
  }
  free(p);
  return;
}

Assistant:

void Abc_NamStop( Abc_Nam_t * p )
{
//Abc_Print( 1, "Starting nam with %d bins.\n", p->nBins );
    Vec_StrErase( &p->vBuffer );
    Vec_IntErase( &p->vInt2Handle );
    Vec_IntErase( &p->vInt2Next );
    ABC_FREE( p->pStore );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}